

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool Js::FunctionProxy::IsConstantFunctionName(char16 *srcName)

{
  char16 *srcName_local;
  
  if ((((srcName == L"glo") || (srcName == L"Anonymous function")) || (srcName == L"Global code"))
     || (((srcName == L"Module code" || (srcName == L"anonymous")) ||
         ((srcName == L"Unknown script code" || (srcName == L"Function code")))))) {
    srcName_local._7_1_ = true;
  }
  else {
    srcName_local._7_1_ = false;
  }
  return srcName_local._7_1_;
}

Assistant:

bool FunctionProxy::IsConstantFunctionName(const char16* srcName)
    {
        if (srcName == Js::Constants::GlobalFunction ||
            srcName == Js::Constants::AnonymousFunction ||
            srcName == Js::Constants::GlobalCode ||
            srcName == Js::Constants::ModuleCode ||
            srcName == Js::Constants::Anonymous ||
            srcName == Js::Constants::UnknownScriptCode ||
            srcName == Js::Constants::FunctionCode)
        {
            return true;
        }
        return false;
    }